

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fBlendTests.cpp
# Opt level: O2

int __thiscall deqp::gles2::Functional::BlendTests::init(BlendTests *this,EVP_PKEY_CTX *ctx)

{
  undefined8 uVar1;
  GLenum GVar2;
  GLenum GVar3;
  uint value;
  int iVar4;
  TestCaseGroup *pTVar5;
  char *pcVar6;
  BlendCase *pBVar7;
  long lVar8;
  long lVar9;
  TestCaseGroup *this_00;
  TestCaseGroup *this_01;
  ulong uVar10;
  ulong uVar11;
  EnumGL *pEVar12;
  undefined1 local_240 [20];
  GLenum GStack_22c;
  Vector<float,_4> local_228;
  EnumGL *local_218;
  long local_210;
  EnumGL *local_208;
  allocator<char> local_1f9;
  string description;
  vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
  paramSets;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  Vector<float,_4> local_108;
  TestCaseGroup *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  Vector<float,_4> local_90;
  Vector<float,_4> local_80;
  Vector<float,_4> local_70;
  Vector<float,_4> local_60;
  Vector<float,_4> local_50;
  Vector<float,_4> local_40;
  
  local_108.m_data[0] = 0.2;
  local_108.m_data[1] = 0.4;
  local_108.m_data[2] = 0.6;
  local_108.m_data[3] = 0.8;
  pTVar5 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).m_context,"equation_src_func_dst_func",
             "Combinations of Blend Equations and Functions");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  for (lVar9 = 0; lVar9 != 3; lVar9 = lVar9 + 1) {
    for (lVar8 = 0; lVar8 != 0xf; lVar8 = lVar8 + 1) {
      local_218 = init::blendFunctions + lVar8;
      for (pEVar12 = (EnumGL *)0x8; pEVar12 != (EnumGL *)0xf8;
          pEVar12 = (EnumGL *)((long)pEVar12 + 0x10)) {
        local_210 = CONCAT44(local_210._4_4_,*(int *)((long)pEVar12 + 0x1e15448));
        if (*(int *)((long)pEVar12 + 0x1e15448) != 0x308) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_128,glcts::fixed_sample_locations_values + 1,
                     (allocator<char> *)&local_148);
          local_208 = pEVar12;
          std::operator+(&local_188,&local_128,init::blendEquations[lVar9].nameStr);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &paramSets,&local_188,"_");
          std::operator+(&description,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &paramSets,local_218->nameStr);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_240,&description,"_");
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_240,*(char **)((long)local_208 + 0x1e15450));
          std::__cxx11::string::~string((string *)local_240);
          std::__cxx11::string::~string((string *)&description);
          std::__cxx11::string::~string((string *)&paramSets);
          std::__cxx11::string::~string((string *)&local_188);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_f0,glcts::fixed_sample_locations_values + 1,
                     (allocator<char> *)&local_d0);
          std::operator+(&local_148,&local_f0,"Equations ");
          GVar2 = init::blendEquations[lVar9].glValue;
          pcVar6 = glu::getBlendEquationName(GVar2);
          std::operator+(&local_128,&local_148,pcVar6);
          std::operator+(&local_188,&local_128,", src funcs ");
          GVar3 = local_218->glValue;
          pcVar6 = glu::getBlendFactorName(GVar3);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &paramSets,&local_188,pcVar6);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_240,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &paramSets,", dst funcs ");
          pcVar6 = glu::getBlendFactorName((GLenum)local_210);
          std::operator+(&description,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_240,pcVar6);
          std::__cxx11::string::~string((string *)local_240);
          std::__cxx11::string::~string((string *)&paramSets);
          std::__cxx11::string::~string((string *)&local_188);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&local_f0);
          paramSets.
          super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          paramSets.
          super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          paramSets.
          super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          tcu::Vector<float,_4>::Vector(&local_40,&local_108);
          local_240._8_4_ = (GLenum)local_210;
          GStack_22c = (GLenum)local_210;
          local_240._16_4_ = GVar3;
          local_240._0_4_ = GVar2;
          local_240._4_4_ = GVar3;
          local_240._12_4_ = GVar2;
          tcu::Vector<float,_4>::Vector(&local_228,&local_40);
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::emplace_back<deqp::gles2::Functional::BlendParams>(&paramSets,(BlendParams *)local_240);
          pBVar7 = (BlendCase *)operator_new(0x338);
          pEVar12 = local_208;
          BlendCase::BlendCase
                    (pBVar7,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                     description._M_dataplus._M_p,&paramSets);
          tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pBVar7);
          std::
          _Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::~_Vector_base((_Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                           *)&paramSets);
          std::__cxx11::string::~string((string *)&description);
          std::__cxx11::string::~string((string *)&name);
        }
      }
    }
  }
  pTVar5 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).m_context,"rgb_func_alpha_func",
             "Combinations of RGB and Alpha Functions");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  this_00 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_00,(this->super_TestCaseGroup).m_context,"src","Source functions");
  this_01 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (this_01,(this->super_TestCaseGroup).m_context,"dst","Destination functions");
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)this_00);
  local_f8 = this_01;
  tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)this_01);
  iVar4 = 0;
  while (iVar4 != 2) {
    local_218 = (EnumGL *)CONCAT44(local_218._4_4_,iVar4);
    pTVar5 = local_f8;
    if (iVar4 == 0) {
      pTVar5 = this_00;
    }
    pcVar6 = " dst";
    if (iVar4 == 0) {
      pcVar6 = " src";
    }
    local_208 = (EnumGL *)(pcVar6 + 1);
    for (lVar9 = 0; lVar9 != 0xf; lVar9 = lVar9 + 1) {
      lVar8 = 0;
      iVar4 = (int)local_218;
      while (lVar8 != 0xf) {
        local_210 = lVar8;
        if ((iVar4 == 0) ||
           ((init::blendFunctions[lVar9].glValue != 0x308 &&
            (init::blendFunctions[lVar8].glValue != 0x308)))) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&paramSets,glcts::fixed_sample_locations_values + 1,
                     (allocator<char> *)&local_188);
          std::operator+(&description,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &paramSets,init::blendFunctions[lVar9].nameStr);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_240,&description,"_");
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_240,init::blendFunctions[lVar8].nameStr);
          std::__cxx11::string::~string((string *)local_240);
          std::__cxx11::string::~string((string *)&description);
          std::__cxx11::string::~string((string *)&paramSets);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_b0,glcts::fixed_sample_locations_values + 1,&local_1f9);
          std::operator+(&local_d0,&local_b0,"RGB ");
          std::operator+(&local_f0,&local_d0,(char *)local_208);
          std::operator+(&local_148,&local_f0," func ");
          GVar2 = init::blendFunctions[lVar9].glValue;
          pcVar6 = glu::getBlendFactorName(GVar2);
          std::operator+(&local_128,&local_148,pcVar6);
          std::operator+(&local_188,&local_128,", alpha ");
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &paramSets,&local_188,(char *)local_208);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_240,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &paramSets," func ");
          value = init::blendFunctions[lVar8].glValue;
          pcVar6 = glu::getBlendFactorName(value);
          std::operator+(&description,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_240,pcVar6);
          std::__cxx11::string::~string((string *)local_240);
          std::__cxx11::string::~string((string *)&paramSets);
          std::__cxx11::string::~string((string *)&local_188);
          std::__cxx11::string::~string((string *)&local_128);
          std::__cxx11::string::~string((string *)&local_148);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_d0);
          std::__cxx11::string::~string((string *)&local_b0);
          paramSets.
          super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          paramSets.
          super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          paramSets.
          super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          tcu::Vector<float,_4>::Vector(&local_50,&local_108);
          local_240._0_4_ = 0x8006;
          local_240._8_4_ = 1;
          local_240._12_4_ = 0x8006;
          GStack_22c = 1;
          local_240._16_4_ = value;
          local_240._4_4_ = GVar2;
          tcu::Vector<float,_4>::Vector(&local_228,&local_50);
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::emplace_back<deqp::gles2::Functional::BlendParams>(&paramSets,(BlendParams *)local_240);
          tcu::Vector<float,_4>::Vector(&local_60,&local_108);
          local_240._0_4_ = 0x8006;
          local_240._8_4_ = 0;
          local_240._12_4_ = 0x8006;
          GStack_22c = 0;
          local_240._4_4_ = GVar2;
          tcu::Vector<float,_4>::Vector(&local_228,&local_60);
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::emplace_back<deqp::gles2::Functional::BlendParams>(&paramSets,(BlendParams *)local_240);
          tcu::Vector<float,_4>::Vector(&local_70,&local_108);
          local_240._0_4_ = 0x8006;
          local_240._8_4_ = 0x300;
          local_240._12_4_ = 0x8006;
          GStack_22c = 0x300;
          local_240._4_4_ = GVar2;
          tcu::Vector<float,_4>::Vector(&local_228,&local_70);
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::emplace_back<deqp::gles2::Functional::BlendParams>(&paramSets,(BlendParams *)local_240);
          tcu::Vector<float,_4>::Vector(&local_80,&local_108);
          local_240._0_4_ = 0x8006;
          local_240._8_4_ = 0x306;
          local_240._12_4_ = 0x8006;
          GStack_22c = 0x306;
          local_240._4_4_ = GVar2;
          tcu::Vector<float,_4>::Vector(&local_228,&local_80);
          std::
          vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::emplace_back<deqp::gles2::Functional::BlendParams>(&paramSets,(BlendParams *)local_240);
          iVar4 = (int)local_218;
          if ((int)local_218 != 0) {
            uVar10 = ((long)paramSets.
                            super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)paramSets.
                           super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x28;
            uVar11 = uVar10 & 0xffffffff;
            if ((int)uVar10 < 1) {
              uVar11 = 0;
            }
            for (lVar8 = 0; uVar11 * 0x28 - lVar8 != 0; lVar8 = lVar8 + 0x28) {
              uVar1 = *(undefined8 *)
                       ((long)((paramSets.
                                super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                                ._M_impl.super__Vector_impl_data._M_start)->blendColor).m_data +
                       lVar8 + -0x14);
              *(ulong *)((long)((paramSets.
                                 super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->blendColor).m_data +
                        lVar8 + -0x14) = CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
              uVar1 = *(undefined8 *)
                       ((long)((paramSets.
                                super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                                ._M_impl.super__Vector_impl_data._M_start)->blendColor).m_data +
                       lVar8 + -8);
              *(ulong *)((long)((paramSets.
                                 super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->blendColor).m_data +
                        lVar8 + -8) = CONCAT44((int)uVar1,(int)((ulong)uVar1 >> 0x20));
            }
          }
          pBVar7 = (BlendCase *)operator_new(0x338);
          BlendCase::BlendCase
                    (pBVar7,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                     description._M_dataplus._M_p,&paramSets);
          tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pBVar7);
          std::
          _Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
          ::~_Vector_base((_Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                           *)&paramSets);
          std::__cxx11::string::~string((string *)&description);
          std::__cxx11::string::~string((string *)&name);
        }
        lVar8 = local_210 + 1;
      }
    }
    iVar4 = (int)local_218 + 1;
  }
  pTVar5 = (TestCaseGroup *)operator_new(0x78);
  TestCaseGroup::TestCaseGroup
            (pTVar5,(this->super_TestCaseGroup).m_context,"rgb_equation_alpha_equation",
             "Combinations of RGB and Alpha Equation Combinations");
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar5);
  for (local_218 = (EnumGL *)0x0; local_218 != (EnumGL *)0x3;
      local_218 = (EnumGL *)((long)local_218 + 1)) {
    local_208 = init::blendEquations + (long)local_218;
    for (lVar9 = 8; lVar9 != 0x38; lVar9 = lVar9 + 0x10) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&paramSets,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_188);
      pEVar12 = local_208;
      local_210 = lVar9;
      std::operator+(&description,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&paramSets
                     ,local_208->nameStr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                     &description,"_");
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_240,*(char **)((long)&init::blendEquations[0].glValue + local_210))
      ;
      std::__cxx11::string::~string((string *)local_240);
      std::__cxx11::string::~string((string *)&description);
      std::__cxx11::string::~string((string *)&paramSets);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_128,glcts::fixed_sample_locations_values + 1,
                 (allocator<char> *)&local_148);
      std::operator+(&local_188,&local_128,"RGB equation ");
      GVar2 = pEVar12->glValue;
      pcVar6 = glu::getBlendEquationName(GVar2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&paramSets
                     ,&local_188,pcVar6);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&paramSets
                     ,", alpha equation ");
      GVar3 = *(GLenum *)((long)&PTR_iterate_01e15418 + local_210);
      pcVar6 = glu::getBlendEquationName(GVar3);
      std::operator+(&description,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240,
                     pcVar6);
      std::__cxx11::string::~string((string *)local_240);
      std::__cxx11::string::~string((string *)&paramSets);
      std::__cxx11::string::~string((string *)&local_188);
      std::__cxx11::string::~string((string *)&local_128);
      paramSets.
      super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      paramSets.
      super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      paramSets.
      super__Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      tcu::Vector<float,_4>::Vector(&local_90,&local_108);
      local_240._4_4_ = 1;
      local_240._8_4_ = 1;
      stack0xfffffffffffffdd0 = &DAT_100000001;
      local_240._0_4_ = GVar2;
      local_240._12_4_ = GVar3;
      tcu::Vector<float,_4>::Vector(&local_228,&local_90);
      std::
      vector<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
      ::emplace_back<deqp::gles2::Functional::BlendParams>(&paramSets,(BlendParams *)local_240);
      pBVar7 = (BlendCase *)operator_new(0x338);
      lVar9 = local_210;
      BlendCase::BlendCase
                (pBVar7,(this->super_TestCaseGroup).m_context,name._M_dataplus._M_p,
                 description._M_dataplus._M_p,&paramSets);
      tcu::TestNode::addChild((TestNode *)pTVar5,(TestNode *)pBVar7);
      std::
      _Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
      ::~_Vector_base((_Vector_base<deqp::gles2::Functional::BlendParams,_std::allocator<deqp::gles2::Functional::BlendParams>_>
                       *)&paramSets);
      std::__cxx11::string::~string((string *)&description);
      std::__cxx11::string::~string((string *)&name);
    }
  }
  return 3;
}

Assistant:

void BlendTests::init (void)
{
	struct EnumGL
	{
		GLenum			glValue;
		const char*		nameStr;
	};

	static const EnumGL blendEquations[] =
	{
		{ GL_FUNC_ADD,					"add"					},
		{ GL_FUNC_SUBTRACT,				"subtract"				},
		{ GL_FUNC_REVERSE_SUBTRACT,		"reverse_subtract"		}
	};

	static const EnumGL blendFunctions[] =
	{
		{ GL_ZERO,							"zero"						},
		{ GL_ONE,							"one"						},
		{ GL_SRC_COLOR,						"src_color"					},
		{ GL_ONE_MINUS_SRC_COLOR,			"one_minus_src_color"		},
		{ GL_DST_COLOR,						"dst_color"					},
		{ GL_ONE_MINUS_DST_COLOR,			"one_minus_dst_color"		},
		{ GL_SRC_ALPHA,						"src_alpha"					},
		{ GL_ONE_MINUS_SRC_ALPHA,			"one_minus_src_alpha"		},
		{ GL_DST_ALPHA,						"dst_alpha"					},
		{ GL_ONE_MINUS_DST_ALPHA,			"one_minus_dst_alpha"		},
		{ GL_CONSTANT_COLOR,				"constant_color"			},
		{ GL_ONE_MINUS_CONSTANT_COLOR,		"one_minus_constant_color"	},
		{ GL_CONSTANT_ALPHA,				"constant_alpha"			},
		{ GL_ONE_MINUS_CONSTANT_ALPHA,		"one_minus_constant_alpha"	},
		{ GL_SRC_ALPHA_SATURATE,			"src_alpha_saturate"		}
	};

	const Vec4 defaultBlendColor(0.2f, 0.4f, 0.6f, 0.8f);

	// Test all blend equation, src blend function, dst blend function combinations. RGB and alpha modes are the same.

	{
		TestCaseGroup* group = new TestCaseGroup(m_context, "equation_src_func_dst_func", "Combinations of Blend Equations and Functions");
		addChild(group);

		for (int equationNdx = 0;	equationNdx < DE_LENGTH_OF_ARRAY(blendEquations);	equationNdx++)
		for (int srcFuncNdx = 0;	srcFuncNdx < DE_LENGTH_OF_ARRAY(blendFunctions);	srcFuncNdx++)
		for (int dstFuncNdx = 0;	dstFuncNdx < DE_LENGTH_OF_ARRAY(blendFunctions);	dstFuncNdx++)
		{
			const EnumGL& eq	= blendEquations[equationNdx];
			const EnumGL& src	= blendFunctions[srcFuncNdx];
			const EnumGL& dst	= blendFunctions[dstFuncNdx];

			if (dst.glValue == GL_SRC_ALPHA_SATURATE) // SRC_ALPHA_SATURATE is only valid for src func.
				continue;

			string name			= string("") + eq.nameStr + "_" + src.nameStr + "_" + dst.nameStr;
			string description	= string("") +
								  "Equations "		+ getBlendEquationName(eq.glValue) +
								  ", src funcs "	+ getBlendFactorName(src.glValue) +
								  ", dst funcs "	+ getBlendFactorName(dst.glValue);

			vector<BlendParams> paramSets;
			paramSets.push_back(BlendParams(eq.glValue, src.glValue, dst.glValue, eq.glValue, src.glValue, dst.glValue, defaultBlendColor));

			group->addChild(new BlendCase(m_context, name.c_str(), description.c_str(), paramSets));
		}
	}

	// Test all RGB src, alpha src and RGB dst, alpha dst combinations. Equations are ADD.
	// \note For all RGB src, alpha src combinations, also test a couple of different RGBA dst functions, and vice versa.

	{
		TestCaseGroup* mainGroup = new TestCaseGroup(m_context, "rgb_func_alpha_func", "Combinations of RGB and Alpha Functions");
		addChild(mainGroup);
		TestCaseGroup* srcGroup = new TestCaseGroup(m_context, "src", "Source functions");
		TestCaseGroup* dstGroup = new TestCaseGroup(m_context, "dst", "Destination functions");
		mainGroup->addChild(srcGroup);
		mainGroup->addChild(dstGroup);

		for (int isDstI = 0;		isDstI <= 1;										isDstI++)
		for (int rgbFuncNdx = 0;	rgbFuncNdx < DE_LENGTH_OF_ARRAY(blendFunctions);	rgbFuncNdx++)
		for (int alphaFuncNdx = 0;	alphaFuncNdx < DE_LENGTH_OF_ARRAY(blendFunctions);	alphaFuncNdx++)
		{
			bool			isSrc			= isDstI == 0;
			TestCaseGroup*	curGroup		= isSrc ? srcGroup : dstGroup;
			const EnumGL&	funcRGB			= blendFunctions[rgbFuncNdx];
			const EnumGL&	funcAlpha		= blendFunctions[alphaFuncNdx];
			const char*		dstOrSrcStr		= isSrc ? "src" : "dst";

			if (!isSrc && (funcRGB.glValue == GL_SRC_ALPHA_SATURATE || funcAlpha.glValue == GL_SRC_ALPHA_SATURATE)) // SRC_ALPHA_SATURATE is only valid for src func.
				continue;

			string name			= string("") + funcRGB.nameStr + "_" + funcAlpha.nameStr;
			string description	= string("") +
								  "RGB "		+ dstOrSrcStr + " func " + getBlendFactorName(funcRGB.glValue) +
								  ", alpha "	+ dstOrSrcStr + " func " + getBlendFactorName(funcAlpha.glValue);

			// First, make param sets as if this was a src case.

			vector<BlendParams> paramSets;
			paramSets.push_back(BlendParams(GL_FUNC_ADD, funcRGB.glValue, GL_ONE,			GL_FUNC_ADD, funcAlpha.glValue, GL_ONE,			defaultBlendColor));
			paramSets.push_back(BlendParams(GL_FUNC_ADD, funcRGB.glValue, GL_ZERO,			GL_FUNC_ADD, funcAlpha.glValue, GL_ZERO,		defaultBlendColor));
			paramSets.push_back(BlendParams(GL_FUNC_ADD, funcRGB.glValue, GL_SRC_COLOR,		GL_FUNC_ADD, funcAlpha.glValue, GL_SRC_COLOR,	defaultBlendColor));
			paramSets.push_back(BlendParams(GL_FUNC_ADD, funcRGB.glValue, GL_DST_COLOR,		GL_FUNC_ADD, funcAlpha.glValue, GL_DST_COLOR,	defaultBlendColor));

			// Swap src and dst params if this is a dst case.

			if (!isSrc)
			{
				for (int i = 0; i < (int)paramSets.size(); i++)
				{
					std::swap(paramSets[i].srcFuncRGB,		paramSets[i].dstFuncRGB);
					std::swap(paramSets[i].srcFuncAlpha,	paramSets[i].dstFuncAlpha);
				}
			}

			curGroup->addChild(new BlendCase(m_context, name.c_str(), description.c_str(), paramSets));
		}
	}

	// Test all RGB and alpha equation combinations. Src and dst funcs are ONE for both.

	{
		TestCaseGroup* group = new TestCaseGroup(m_context, "rgb_equation_alpha_equation", "Combinations of RGB and Alpha Equation Combinations");
		addChild(group);

		for (int equationRGBNdx = 0;	equationRGBNdx < DE_LENGTH_OF_ARRAY(blendEquations);	equationRGBNdx++)
		for (int equationAlphaNdx = 0;	equationAlphaNdx < DE_LENGTH_OF_ARRAY(blendEquations);	equationAlphaNdx++)
		{
			const EnumGL& eqRGB			= blendEquations[equationRGBNdx];
			const EnumGL& eqAlpha		= blendEquations[equationAlphaNdx];

			string name			= string("") + eqRGB.nameStr + "_" + eqAlpha.nameStr;
			string description	= string("") +
								  "RGB equation "		+ getBlendEquationName(eqRGB.glValue) +
								  ", alpha equation "	+ getBlendEquationName(eqAlpha.glValue);

			vector<BlendParams> paramSets;
			paramSets.push_back(BlendParams(eqRGB.glValue, GL_ONE, GL_ONE, eqAlpha.glValue, GL_ONE, GL_ONE, defaultBlendColor));

			group->addChild(new BlendCase(m_context, name.c_str(), description.c_str(), paramSets));
		}
	}
}